

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O0

ACT_TYPE __thiscall
despot::ModeStatePolicy::Action
          (ModeStatePolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  value_type pSVar2;
  StateIndexer *pSVar3;
  int iVar4;
  size_type sVar5;
  const_reference ppSVar6;
  reference pvVar7;
  int local_50;
  int i_1;
  int id;
  State *particle;
  value_type pSStack_38;
  int i;
  State *mode;
  double maxWeight;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  ModeStatePolicy *this_local;
  
  mode = (State *)0x0;
  pSStack_38 = (value_type)0x0;
  particle._4_4_ = 0;
  while( true ) {
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar5 <= (ulong)(long)particle._4_4_) break;
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)particle._4_4_);
    pSVar2 = *ppSVar6;
    iVar4 = (*this->indexer_->_vptr_StateIndexer[3])(this->indexer_,pSVar2);
    dVar1 = pSVar2->weight;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->state_probs_,(long)iVar4);
    *pvVar7 = dVar1 + *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->state_probs_,(long)iVar4);
    if ((double)mode < *pvVar7) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->state_probs_,(long)iVar4);
      mode = (State *)*pvVar7;
      pSStack_38 = pSVar2;
    }
    particle._4_4_ = particle._4_4_ + 1;
  }
  local_50 = 0;
  while( true ) {
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar5 <= (ulong)(long)local_50) break;
    pSVar3 = this->indexer_;
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)local_50);
    iVar4 = (*pSVar3->_vptr_StateIndexer[3])(pSVar3,*ppSVar6);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->state_probs_,(long)iVar4);
    *pvVar7 = 0.0;
    local_50 = local_50 + 1;
  }
  if (pSStack_38 != (value_type)0x0) {
    iVar4 = (*this->policy_->_vptr_StatePolicy[2])(this->policy_,pSStack_38);
    return iVar4;
  }
  __assert_fail("mode != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/builtin_policy.cpp"
                ,0x8b,
                "virtual ACT_TYPE despot::ModeStatePolicy::Action(const vector<State *> &, RandomStreams &, History &) const"
               );
}

Assistant:

ACT_TYPE ModeStatePolicy::Action(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	double maxWeight = 0;
	State* mode = NULL;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		int id = indexer_.GetIndex(particle);
		state_probs_[id] += particle->weight;

		if (state_probs_[id] > maxWeight) {
			maxWeight = state_probs_[id];
			mode = particle;
		}
	}

	for (int i = 0; i < particles.size(); i++) {
		state_probs_[indexer_.GetIndex(particles[i])] = 0;
	}

	assert(mode != NULL);
	return policy_.GetAction(*mode);
}